

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cforeach.c
# Opt level: O0

char * cforeach_openTag(FILE *out,char *line)

{
  csafestring_t *line_00;
  csafestring_t *name;
  csafestring_t *pcVar1;
  FILE *out_00;
  csafestring_t *var_00;
  csafestring_t *begin_00;
  char *pcVar2;
  csafestring_t *items;
  csafestring_t *step;
  csafestring_t *end;
  csafestring_t *begin;
  csafestring_t *statusVar;
  csafestring_t *var;
  csafestring_t *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  line_00 = modules_extractVariable(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  name = modules_extractVariable((char *)line_00,in_stack_ffffffffffffffe0);
  pcVar1 = modules_extractVariable((char *)line_00,(char *)name);
  out_00 = (FILE *)modules_extractVariable((char *)line_00,(char *)name);
  var_00 = modules_extractVariable((char *)line_00,(char *)name);
  begin_00 = modules_extractVariable((char *)line_00,(char *)name);
  if (((line_00 == (csafestring_t *)0x0) || (begin_00 == (csafestring_t *)0x0)) ||
     (name == (csafestring_t *)0x0)) {
    if (((line_00 != (csafestring_t *)0x0) && (pcVar1 != (csafestring_t *)0x0)) &&
       (out_00 != (FILE *)0x0)) {
      cforeach_counterLoop
                (out_00,var_00,begin_00,in_stack_ffffffffffffffb8,(csafestring_t *)0x1061fb);
    }
  }
  else {
    cforeach_elementLoop(out_00,var_00,begin_00,in_stack_ffffffffffffffb8);
  }
  safe_destroy((csafestring_t *)0x106207);
  safe_destroy((csafestring_t *)0x106211);
  safe_destroy((csafestring_t *)0x10621b);
  safe_destroy((csafestring_t *)0x106225);
  safe_destroy((csafestring_t *)0x10622f);
  safe_destroy((csafestring_t *)0x106239);
  pcVar2 = modules_findEndOfTag((char *)0x106243);
  return pcVar2 + 1;
}

Assistant:

static char *cforeach_openTag(FILE *out, char *line) {
	csafestring_t *var = modules_extractVariable(line, "var");
	csafestring_t *statusVar = modules_extractVariable(line, "statusVar");
	csafestring_t *begin = modules_extractVariable(line, "begin");
	csafestring_t *end = modules_extractVariable(line, "end");
	csafestring_t *step = modules_extractVariable(line, "step");
	csafestring_t *items = modules_extractVariable(line, "items");

	if ( var != NULL && items != NULL && statusVar != NULL ) {
		cforeach_elementLoop(out, var, statusVar, items);
	} else if ( var != NULL && begin != NULL && end != NULL ) {
		cforeach_counterLoop(out, var, begin, end, step);
	}

	safe_destroy(var);
	safe_destroy(statusVar);
	safe_destroy(begin);
	safe_destroy(end);
	safe_destroy(step);
	safe_destroy(items);
	return modules_findEndOfTag(line) + 1;
}